

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O1

void set_st_cfg_to_frm(EncFrmStatus *frm,RK_S32 seq_idx,MppEncRefStFrmCfg *st_cfg)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (ulong)(seq_idx == 0) * 0x20 +
          ((ulong)(((uint)(seq_idx == 0) << 5) >> 1) | (ulong)(uint)seq_idx << 0x30) + 1;
  frm->val = uVar1;
  uVar3 = (ulong)((st_cfg->is_non_ref & 1U) << 6);
  uVar4 = uVar3 | uVar1;
  frm->val = uVar4;
  uVar2 = (ulong)((st_cfg->temporal_id & 0xfU) << 0xc);
  frm->val = uVar2 | uVar4;
  uVar1 = uVar2 | uVar3 | uVar1 | (ulong)((st_cfg->ref_mode & 0x3f) << 0x10);
  frm->val = uVar1;
  frm->val = uVar1 | (st_cfg->ref_arg & 0xffU) << 0x16;
  if (((byte)enc_refs_debug & 4) == 0) {
    return;
  }
  _dump_frm(frm,"set_st_cfg_to_frm",0x13f);
  return;
}

Assistant:

static void set_st_cfg_to_frm(EncFrmStatus *frm, RK_S32 seq_idx,
                              MppEncRefStFrmCfg *st_cfg)
{
    memset(frm, 0, sizeof(*frm));

    frm->seq_idx = seq_idx;
    frm->valid = 1;
    frm->is_idr = (seq_idx == 0);
    frm->is_intra = frm->is_idr;
    frm->is_non_ref = st_cfg->is_non_ref;
    frm->is_lt_ref = 0;
    frm->temporal_id = st_cfg->temporal_id;
    frm->ref_mode = st_cfg->ref_mode;
    frm->ref_arg = st_cfg->ref_arg;

    if (enc_refs_debug & MPP_ENC_REFS_DBG_FRM)
        dump_frm(frm);
}